

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

CollationElementIterator * __thiscall
icu_63::CollationElementIterator::operator=
          (CollationElementIterator *this,CollationElementIterator *other)

{
  UBool UVar1;
  int32_t initialCapacity;
  FCDUTF16CollationIterator *pFVar2;
  char16_t *pcVar3;
  UVector32 *this_00;
  pointer_____offset_0x10___ *src;
  FCDUTF16CollationIterator *pFVar4;
  UVector32 *local_f0;
  FCDUTF16CollationIterator *local_c8;
  FCDUTF16CollationIterator *local_c0;
  FCDUTF16CollationIterator *local_98;
  FCDUTF16CollationIterator *local_90;
  UErrorCode local_68;
  undefined1 local_61;
  UErrorCode errorCode;
  FCDUTF16CollationIterator *local_58;
  UTF16CollationIterator *otherIter;
  undefined1 local_39;
  FCDUTF16CollationIterator *local_38;
  FCDUTF16CollationIterator *local_30;
  FCDUTF16CollationIterator *otherFCDIter;
  CollationIterator *newIter;
  CollationElementIterator *other_local;
  CollationElementIterator *this_local;
  
  if (this != other) {
    newIter = (CollationIterator *)other;
    other_local = this;
    if (other->iter_ == (CollationIterator *)0x0) {
      local_90 = (FCDUTF16CollationIterator *)0x0;
      src = (pointer_____offset_0x10___ *)other;
    }
    else {
      src = &CollationIterator::typeinfo;
      local_90 = (FCDUTF16CollationIterator *)
                 __dynamic_cast(other->iter_,&CollationIterator::typeinfo,
                                &FCDUTF16CollationIterator::typeinfo,0);
    }
    local_30 = local_90;
    if (local_90 == (FCDUTF16CollationIterator *)0x0) {
      if (newIter->trie == (UTrie2 *)0x0) {
        local_c0 = (FCDUTF16CollationIterator *)0x0;
      }
      else {
        src = &CollationIterator::typeinfo;
        local_c0 = (FCDUTF16CollationIterator *)
                   __dynamic_cast(newIter->trie,&CollationIterator::typeinfo,
                                  &UTF16CollationIterator::typeinfo,0);
      }
      local_58 = local_c0;
      if (local_c0 == (FCDUTF16CollationIterator *)0x0) {
        otherFCDIter = (FCDUTF16CollationIterator *)0x0;
      }
      else {
        pFVar2 = (FCDUTF16CollationIterator *)UMemory::operator_new((UMemory *)0x1a0,(size_t)src);
        pFVar4 = local_58;
        local_61 = 0;
        local_c8 = (FCDUTF16CollationIterator *)0x0;
        if (pFVar2 != (FCDUTF16CollationIterator *)0x0) {
          local_61 = 1;
          _errorCode = pFVar2;
          pcVar3 = UnicodeString::getBuffer(&this->string_);
          UTF16CollationIterator::UTF16CollationIterator
                    ((UTF16CollationIterator *)pFVar2,&pFVar4->super_UTF16CollationIterator,pcVar3);
          src = (pointer_____offset_0x10___ *)pFVar4;
          local_c8 = pFVar2;
        }
        otherFCDIter = local_c8;
      }
    }
    else {
      pFVar2 = (FCDUTF16CollationIterator *)UMemory::operator_new((UMemory *)0x210,(size_t)src);
      pFVar4 = local_30;
      local_39 = 0;
      local_98 = (FCDUTF16CollationIterator *)0x0;
      if (pFVar2 != (FCDUTF16CollationIterator *)0x0) {
        local_39 = 1;
        local_38 = pFVar2;
        pcVar3 = UnicodeString::getBuffer(&this->string_);
        FCDUTF16CollationIterator::FCDUTF16CollationIterator(pFVar2,pFVar4,pcVar3);
        src = (pointer_____offset_0x10___ *)pFVar4;
        local_98 = pFVar2;
      }
      otherFCDIter = local_98;
    }
    if (otherFCDIter != (FCDUTF16CollationIterator *)0x0) {
      if (this->iter_ != (CollationIterator *)0x0) {
        (*(this->iter_->super_UObject)._vptr_UObject[1])();
      }
      this->iter_ = (CollationIterator *)otherFCDIter;
      this->rbc_ = (RuleBasedCollator *)newIter->data;
      this->otherHalf_ = (newIter->ceBuffer).length;
      this->dir_ = (newIter->ceBuffer).field_0x4;
      src = (pointer_____offset_0x10___ *)&(newIter->ceBuffer).buffer.capacity;
      UnicodeString::operator=(&this->string_,(UnicodeString *)src);
    }
    if ((((char)(newIter->ceBuffer).field_0x4 < '\0') &&
        ((newIter->ceBuffer).buffer.ptr != (long *)0x0)) &&
       (UVar1 = UVector32::isEmpty((UVector32 *)(newIter->ceBuffer).buffer.ptr), UVar1 == '\0')) {
      local_68 = U_ZERO_ERROR;
      if (this->offsets_ == (UVector32 *)0x0) {
        this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)src);
        local_f0 = (UVector32 *)0x0;
        if (this_00 != (UVector32 *)0x0) {
          initialCapacity = UVector32::size((UVector32 *)(newIter->ceBuffer).buffer.ptr);
          UVector32::UVector32(this_00,initialCapacity,&local_68);
          local_f0 = this_00;
        }
        this->offsets_ = local_f0;
      }
      if (this->offsets_ != (UVector32 *)0x0) {
        UVector32::assign(this->offsets_,(UVector32 *)(newIter->ceBuffer).buffer.ptr,&local_68);
      }
    }
  }
  return this;
}

Assistant:

const CollationElementIterator& CollationElementIterator::operator=(
                                         const CollationElementIterator& other)
{
    if (this == &other) {
        return *this;
    }

    CollationIterator *newIter;
    const FCDUTF16CollationIterator *otherFCDIter =
            dynamic_cast<const FCDUTF16CollationIterator *>(other.iter_);
    if(otherFCDIter != NULL) {
        newIter = new FCDUTF16CollationIterator(*otherFCDIter, string_.getBuffer());
    } else {
        const UTF16CollationIterator *otherIter =
                dynamic_cast<const UTF16CollationIterator *>(other.iter_);
        if(otherIter != NULL) {
            newIter = new UTF16CollationIterator(*otherIter, string_.getBuffer());
        } else {
            newIter = NULL;
        }
    }
    if(newIter != NULL) {
        delete iter_;
        iter_ = newIter;
        rbc_ = other.rbc_;
        otherHalf_ = other.otherHalf_;
        dir_ = other.dir_;

        string_ = other.string_;
    }
    if(other.dir_ < 0 && other.offsets_ != NULL && !other.offsets_->isEmpty()) {
        UErrorCode errorCode = U_ZERO_ERROR;
        if(offsets_ == NULL) {
            offsets_ = new UVector32(other.offsets_->size(), errorCode);
        }
        if(offsets_ != NULL) {
            offsets_->assign(*other.offsets_, errorCode);
        }
    }
    return *this;
}